

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra86.c
# Opt level: O3

SizeT x86_Convert(Byte *data,SizeT size,UInt32 ip,UInt32 *state,int encoding)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  Byte *pBVar4;
  sbyte sVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  Byte *pBVar13;
  uint uVar14;
  uint uVar15;
  UInt32 UVar16;
  Byte *pBVar17;
  long lVar18;
  
  if (size < 5) {
    return 0;
  }
  uVar14 = *state & 7;
  pBVar13 = data + (size - 4);
  pBVar4 = data;
  if (data < pBVar13) {
    iVar7 = (ip - (int)data) + 5;
    iVar12 = ((int)data - ip) + -5;
    lVar18 = -(long)data;
    pBVar17 = (Byte *)0x0;
    do {
      lVar10 = 0;
      while ((pBVar4[lVar10] & 0xfe) != 0xe8) {
        lVar3 = lVar10 + 1;
        lVar10 = lVar10 + 1;
        if (pBVar13 <= pBVar4 + lVar3) {
          pBVar4 = pBVar4 + lVar10;
          goto LAB_00735207;
        }
      }
      iVar9 = (int)lVar10;
      uVar11 = 0;
      if ((pBVar4 + lVar10 + (lVar18 - (long)pBVar17) < (Byte *)0x3) &&
         (bVar1 = (((char)pBVar4 - (char)data) - (char)pBVar17) + (char)lVar10 & 0x1f,
         uVar15 = uVar14 >> bVar1, uVar14 >> bVar1 != 0)) {
        uVar14 = uVar15 >> 1;
        if ((uVar15 != 3 && uVar15 < 5) &&
           (uVar11 = uVar15, 1 < (byte)(pBVar4[lVar10 + 1 + (ulong)uVar14] + 1))) goto LAB_00735124;
LAB_00735142:
        uVar14 = uVar14 | 4;
        lVar3 = lVar10 + lVar18 + 1;
      }
      else {
LAB_00735124:
        if ((pBVar4[lVar10 + 4] + 1 & 0xfe) != 0) {
          uVar14 = uVar11 >> 1;
          goto LAB_00735142;
        }
        iVar2 = (int)pBVar4;
        iVar8 = (iVar12 - iVar2) - iVar9;
        if (encoding != 0) {
          iVar8 = iVar7 + iVar2 + iVar9;
        }
        uVar14 = iVar8 + ((uint)pBVar4[lVar10 + 1] |
                         (uint)pBVar4[lVar10 + 2] << 8 |
                         (uint)pBVar4[lVar10 + 3] << 0x10 | (uint)pBVar4[lVar10 + 4] << 0x18);
        if ((uVar11 != 0) &&
           (sVar5 = (sbyte)((uVar11 & 6) << 2), ((uVar14 >> sVar5) + 1 & 0xfe) == 0)) {
          uVar14 = uVar14 ^ (0x100 << sVar5) - 1U;
          if (encoding == 0) {
            uVar14 = (uVar14 + (iVar12 - iVar2)) - iVar9;
          }
          else {
            uVar14 = uVar14 + iVar7 + iVar2 + iVar9;
          }
        }
        lVar3 = lVar18 + lVar10 + 5;
        pBVar4[lVar10 + 1] = (Byte)uVar14;
        pBVar4[lVar10 + 2] = (Byte)(uVar14 >> 8);
        pBVar4[lVar10 + 3] = (Byte)(uVar14 >> 0x10);
        pBVar4[lVar10 + 4] = (Byte)((int)(uVar14 << 7) >> 0x1f);
        uVar14 = 0;
      }
      pBVar17 = pBVar4 + lVar3;
      pBVar4 = data + (long)pBVar17;
    } while (pBVar4 < pBVar13);
  }
  else {
    pBVar17 = (Byte *)0x0;
  }
LAB_00735207:
  uVar6 = ((long)pBVar4 - (long)data) - (long)pBVar17;
  UVar16 = uVar14 >> ((byte)uVar6 & 0x1f);
  if (2 < uVar6) {
    UVar16 = 0;
  }
  *state = UVar16;
  return (long)pBVar4 - (long)data;
}

Assistant:

SizeT x86_Convert(Byte *data, SizeT size, UInt32 ip, UInt32 *state, int encoding)
{
  SizeT pos = 0;
  UInt32 mask = *state & 7;
  if (size < 5)
    return 0;
  size -= 4;
  ip += 5;

  for (;;)
  {
    Byte *p = data + pos;
    const Byte *limit = data + size;
    for (; p < limit; p++)
      if ((*p & 0xFE) == 0xE8)
        break;

    {
      SizeT d = (SizeT)(p - data - pos);
      pos = (SizeT)(p - data);
      if (p >= limit)
      {
        *state = (d > 2 ? 0 : mask >> (unsigned)d);
        return pos;
      }
      if (d > 2)
        mask = 0;
      else
      {
        mask >>= (unsigned)d;
        if (mask != 0 && (mask > 4 || mask == 3 || Test86MSByte(p[(mask >> 1) + 1])))
        {
          mask = (mask >> 1) | 4;
          pos++;
          continue;
        }
      }
    }

    if (Test86MSByte(p[4]))
    {
      UInt32 v = ((UInt32)p[4] << 24) | ((UInt32)p[3] << 16) | ((UInt32)p[2] << 8) | ((UInt32)p[1]);
      UInt32 cur = ip + (UInt32)pos;
      pos += 5;
      if (encoding)
        v += cur;
      else
        v -= cur;
      if (mask != 0)
      {
        unsigned sh = (mask & 6) << 2;
        if (Test86MSByte((Byte)(v >> sh)))
        {
          v ^= (((UInt32)0x100 << sh) - 1);
          if (encoding)
            v += cur;
          else
            v -= cur;
        }
        mask = 0;
      }
      p[1] = (Byte)v;
      p[2] = (Byte)(v >> 8);
      p[3] = (Byte)(v >> 16);
      p[4] = (Byte)(0 - ((v >> 24) & 1));
    }
    else
    {
      mask = (mask >> 1) | 4;
      pos++;
    }
  }
}